

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O1

int * __thiscall
dnet::data_types::tensor<int,_3U>::operator[](tensor<int,_3U> *this,array<unsigned_int,_3UL> *i)

{
  ulong uVar1;
  size_t t;
  long lVar2;
  exception *__return_storage_ptr__;
  int ret;
  int iVar3;
  ulong uVar4;
  axes_type ii;
  uint local_74 [3];
  string local_68;
  string local_48;
  
  lVar2 = 0;
  do {
    local_74[(this->_axes_sort)._M_elems[lVar2]] = i->_M_elems[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  if (i->_M_elems[0] < (this->_shape)._M_elems[0]) {
    uVar1 = 0;
    do {
      uVar4 = uVar1;
      if (uVar4 == 2) break;
      uVar1 = uVar4 + 1;
    } while (i->_M_elems[uVar4 + 1] < (this->_shape)._M_elems[uVar4 + 1]);
    if (1 < uVar4) {
      lVar2 = 0;
      iVar3 = 0;
      do {
        iVar3 = iVar3 + (this->_facts)._M_elems[lVar2] * local_74[lVar2];
        lVar2 = lVar2 + 1;
      } while (lVar2 != 3);
      return (this->_data).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + iVar3;
    }
  }
  __return_storage_ptr__ = (exception *)__cxa_allocate_exception(0x40);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"matrix","");
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Index out of range.","");
  misc::make_error(__return_storage_ptr__,&local_48,&local_68);
  __cxa_throw(__return_storage_ptr__,&misc::exception::typeinfo,misc::exception::~exception);
}

Assistant:

T &tensor<T, N>::operator[](const std::array<index_type, N> &i)
        {
            axes_type ii;
            for (size_t t = 0; t < i.size(); t++)
                ii[this->_axes_sort[t]] = i[t];
            if (!this->check(i)) {
                throw misc::make_error("matrix", "Index out of range.");
            }
            return this->_data[this->to_index(ii)];
        }